

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t parse_file_extra_redir(archive_read *a,archive_entry *e,rar5 *rar,ssize_t *extra_data_size)

{
  wchar_t wVar1;
  uint8_t *local_2050;
  uint8_t *p;
  char target_utf8_buf [8192];
  size_t local_40;
  size_t target_size;
  uint64_t value_size;
  ssize_t *extra_data_size_local;
  rar5 *rar_local;
  archive_entry *e_local;
  archive_read *a_local;
  
  target_size = 0;
  local_40 = 0;
  value_size = (uint64_t)extra_data_size;
  extra_data_size_local = (ssize_t *)rar;
  rar_local = (rar5 *)e;
  e_local = (archive_entry *)a;
  wVar1 = read_var(a,&(rar->file).redir_type,&target_size);
  if (wVar1 == L'\0') {
    a_local._4_4_ = L'\x01';
  }
  else {
    wVar1 = consume((archive_read *)e_local,target_size);
    if (wVar1 == L'\0') {
      *(size_t *)value_size = *(long *)value_size - target_size;
      wVar1 = read_var((archive_read *)e_local,(uint64_t *)(extra_data_size_local + 0xa60),
                       &target_size);
      if (wVar1 == L'\0') {
        a_local._4_4_ = L'\x01';
      }
      else {
        wVar1 = consume((archive_read *)e_local,target_size);
        if (wVar1 == L'\0') {
          *(size_t *)value_size = *(long *)value_size - target_size;
          wVar1 = read_var_sized((archive_read *)e_local,&local_40,(size_t *)0x0);
          if (wVar1 == L'\0') {
            a_local._4_4_ = L'\x01';
          }
          else {
            *(size_t *)value_size = *(long *)value_size - (local_40 + 1);
            wVar1 = read_ahead((archive_read *)e_local,local_40,&local_2050);
            if (wVar1 == L'\0') {
              a_local._4_4_ = L'\x01';
            }
            else if (local_40 < 0x800) {
              if (local_40 == 0) {
                archive_set_error((archive *)e_local,0x54,"No link target specified");
                a_local._4_4_ = L'\xffffffe2';
              }
              else {
                memcpy(&p,local_2050,local_40);
                target_utf8_buf[local_40 - 8] = '\0';
                wVar1 = consume((archive_read *)e_local,local_40);
                if (wVar1 == L'\0') {
                  if (extra_data_size_local[0xa5f] - 1U < 2) {
                    archive_entry_set_filetype((archive_entry *)rar_local,0xa000);
                    archive_entry_update_symlink_utf8((archive_entry *)rar_local,(char *)&p);
                    if ((extra_data_size_local[0xa60] & 1U) == 0) {
                      archive_entry_set_symlink_type((archive_entry *)rar_local,L'\x01');
                    }
                    else {
                      archive_entry_set_symlink_type((archive_entry *)rar_local,L'\x02');
                    }
                  }
                  else if (extra_data_size_local[0xa5f] == 4) {
                    archive_entry_set_filetype((archive_entry *)rar_local,0x8000);
                    archive_entry_update_hardlink_utf8((archive_entry *)rar_local,(char *)&p);
                  }
                  a_local._4_4_ = L'\0';
                }
                else {
                  a_local._4_4_ = L'\x01';
                }
              }
            }
            else {
              archive_set_error((archive *)e_local,0x54,"Link target is too long");
              a_local._4_4_ = L'\xffffffe2';
            }
          }
        }
        else {
          a_local._4_4_ = L'\x01';
        }
      }
    }
    else {
      a_local._4_4_ = L'\x01';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int parse_file_extra_redir(struct archive_read* a,
    struct archive_entry* e, struct rar5* rar, ssize_t* extra_data_size)
{
	uint64_t value_size = 0;
	size_t target_size = 0;
	char target_utf8_buf[MAX_NAME_IN_BYTES];
	const uint8_t* p;

	if(!read_var(a, &rar->file.redir_type, &value_size))
		return ARCHIVE_EOF;
	if(ARCHIVE_OK != consume(a, (int64_t)value_size))
		return ARCHIVE_EOF;
	*extra_data_size -= value_size;

	if(!read_var(a, &rar->file.redir_flags, &value_size))
		return ARCHIVE_EOF;
	if(ARCHIVE_OK != consume(a, (int64_t)value_size))
		return ARCHIVE_EOF;
	*extra_data_size -= value_size;

	if(!read_var_sized(a, &target_size, NULL))
		return ARCHIVE_EOF;
	*extra_data_size -= target_size + 1;

	if(!read_ahead(a, target_size, &p))
		return ARCHIVE_EOF;

	if(target_size > (MAX_NAME_IN_CHARS - 1)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Link target is too long");
		return ARCHIVE_FATAL;
	}

	if(target_size == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "No link target specified");
		return ARCHIVE_FATAL;
	}

	memcpy(target_utf8_buf, p, target_size);
	target_utf8_buf[target_size] = 0;

	if(ARCHIVE_OK != consume(a, (int64_t)target_size))
		return ARCHIVE_EOF;

	switch(rar->file.redir_type) {
		case REDIR_TYPE_UNIXSYMLINK:
		case REDIR_TYPE_WINSYMLINK:
			archive_entry_set_filetype(e, AE_IFLNK);
			archive_entry_update_symlink_utf8(e, target_utf8_buf);
			if (rar->file.redir_flags & REDIR_SYMLINK_IS_DIR) {
				archive_entry_set_symlink_type(e,
					AE_SYMLINK_TYPE_DIRECTORY);
			} else {
				archive_entry_set_symlink_type(e,
				AE_SYMLINK_TYPE_FILE);
			}
			break;

		case REDIR_TYPE_HARDLINK:
			archive_entry_set_filetype(e, AE_IFREG);
			archive_entry_update_hardlink_utf8(e, target_utf8_buf);
			break;

		default:
			/* Unknown redir type, skip it. */
			break;
	}
	return ARCHIVE_OK;
}